

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinFerTron_dns.c
# Opt level: O0

int main(void)

{
  int iVar1;
  undefined4 uVar2;
  undefined8 *__ptr;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  N_Vector u_00;
  N_Vector s_00;
  sunrealtype scsteptol_00;
  SUNLinearSolver LS;
  SUNMatrix J;
  void *kmem;
  int retval;
  int mset;
  int glstr;
  N_Vector c;
  N_Vector s;
  N_Vector u;
  N_Vector u2;
  N_Vector u1;
  sunrealtype scsteptol;
  sunrealtype fnormtol;
  UserData data;
  SUNContext sunctx;
  int opt;
  char *pcVar7;
  void *retvalvalue;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined8 local_10;
  int local_4;
  
  local_4 = 0;
  retvalvalue = (void *)0x0;
  pcVar7 = (char *)0x0;
  opt = 0;
  SUNContext_Create(0,&local_10);
  iVar1 = check_retval(retvalvalue,pcVar7,opt);
  if (iVar1 == 0) {
    __ptr = (undefined8 *)malloc(0x20);
    *__ptr = 0x3fd0000000000000;
    __ptr[2] = 0x3ff0000000000000;
    __ptr[1] = 0x3ff8000000000000;
    __ptr[3] = 0x401921fb4d12d84a;
    uVar3 = N_VNew_Serial(6,local_10);
    iVar1 = check_retval(retvalvalue,pcVar7,opt);
    if (iVar1 == 0) {
      uVar4 = N_VNew_Serial(6,local_10);
      iVar1 = check_retval(retvalvalue,pcVar7,opt);
      if (iVar1 == 0) {
        uVar5 = N_VNew_Serial(6,local_10);
        iVar1 = check_retval(retvalvalue,pcVar7,opt);
        if (iVar1 == 0) {
          uVar6 = N_VNew_Serial(6,local_10);
          iVar1 = check_retval(retvalvalue,pcVar7,opt);
          if (iVar1 == 0) {
            u_00 = (N_Vector)N_VNew_Serial(6,local_10);
            iVar1 = check_retval(retvalvalue,pcVar7,opt);
            if (iVar1 == 0) {
              SetInitialGuess1(u_00,(UserData)
                                    CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
              SetInitialGuess2(u_00,(UserData)
                                    CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
              N_VConst(0x3ff0000000000000,uVar6);
              **(undefined8 **)((long)u_00->content + 0x10) = 0;
              *(undefined8 *)(*(long *)((long)u_00->content + 0x10) + 8) = 0;
              *(undefined8 *)(*(long *)((long)u_00->content + 0x10) + 0x10) = 0x3ff0000000000000;
              *(undefined8 *)(*(long *)((long)u_00->content + 0x10) + 0x18) = 0xbff0000000000000;
              *(undefined8 *)(*(long *)((long)u_00->content + 0x10) + 0x20) = 0x3ff0000000000000;
              *(undefined8 *)(*(long *)((long)u_00->content + 0x10) + 0x28) = 0xbff0000000000000;
              s_00 = (N_Vector)KINCreate(local_10);
              iVar1 = check_retval(s_00,pcVar7,opt);
              if (iVar1 == 0) {
                KINSetUserData(s_00,__ptr);
                iVar1 = check_retval(s_00,pcVar7,opt);
                if (iVar1 == 0) {
                  KINSetConstraints(s_00,u_00);
                  iVar1 = check_retval(s_00,pcVar7,opt);
                  if (iVar1 == 0) {
                    KINSetFuncNormTol(0x3ee4f8b588e368f1,s_00);
                    iVar1 = check_retval(s_00,pcVar7,opt);
                    if (iVar1 == 0) {
                      KINSetScaledStepTol(0x3ee4f8b588e368f1,s_00);
                      iVar1 = check_retval(s_00,pcVar7,opt);
                      if (iVar1 == 0) {
                        KINInit(s_00,func,uVar5);
                        iVar1 = check_retval(s_00,pcVar7,opt);
                        if (iVar1 == 0) {
                          pcVar7 = (char *)SUNDenseMatrix(6,6,local_10);
                          iVar1 = check_retval(s_00,pcVar7,opt);
                          if (iVar1 == 0) {
                            scsteptol_00 = (sunrealtype)SUNLinSol_Dense(uVar5,pcVar7,local_10);
                            iVar1 = check_retval(s_00,pcVar7,(int)((ulong)scsteptol_00 >> 0x20));
                            if (iVar1 == 0) {
                              uVar2 = KINSetLinearSolver(s_00,scsteptol_00,pcVar7);
                              iVar1 = check_retval(s_00,pcVar7,(int)((ulong)scsteptol_00 >> 0x20));
                              if (iVar1 == 0) {
                                PrintHeader((sunrealtype)pcVar7,scsteptol_00);
                                printf("\n------------------------------------------\n");
                                printf("\nInitial guess on lower bounds\n");
                                printf("  [x1,x2] = ");
                                PrintOutput((N_Vector)0x10185e);
                                N_VScale(0x3ff0000000000000,uVar3,uVar5);
                                SolveIt((void *)0x1,
                                        (N_Vector)CONCAT44(uVar2,in_stack_ffffffffffffffa0),s_00,
                                        (int)((ulong)pcVar7 >> 0x20),(int)pcVar7);
                                N_VScale(0x3ff0000000000000,uVar3,uVar5);
                                SolveIt((void *)0x100000001,
                                        (N_Vector)CONCAT44(uVar2,in_stack_ffffffffffffffa0),s_00,
                                        (int)((ulong)pcVar7 >> 0x20),(int)pcVar7);
                                N_VScale(0x3ff0000000000000,uVar3,uVar5);
                                SolveIt((void *)0x0,
                                        (N_Vector)CONCAT44(uVar2,in_stack_ffffffffffffffa0),s_00,
                                        (int)((ulong)pcVar7 >> 0x20),(int)pcVar7);
                                N_VScale(0x3ff0000000000000,uVar3,uVar5);
                                SolveIt((void *)0x100000000,
                                        (N_Vector)CONCAT44(uVar2,in_stack_ffffffffffffffa0),s_00,
                                        (int)((ulong)pcVar7 >> 0x20),(int)pcVar7);
                                printf("\n------------------------------------------\n");
                                printf("\nInitial guess in middle of feasible region\n");
                                printf("  [x1,x2] = ");
                                PrintOutput((N_Vector)0x1019a2);
                                N_VScale(0x3ff0000000000000,uVar4,uVar5);
                                SolveIt((void *)0x1,
                                        (N_Vector)CONCAT44(uVar2,in_stack_ffffffffffffffa0),s_00,
                                        (int)((ulong)pcVar7 >> 0x20),(int)pcVar7);
                                N_VScale(0x3ff0000000000000,uVar4,uVar5);
                                SolveIt((void *)0x100000001,
                                        (N_Vector)CONCAT44(uVar2,in_stack_ffffffffffffffa0),s_00,
                                        (int)((ulong)pcVar7 >> 0x20),(int)pcVar7);
                                N_VScale(0x3ff0000000000000,uVar4,uVar5);
                                SolveIt((void *)0x0,
                                        (N_Vector)CONCAT44(uVar2,in_stack_ffffffffffffffa0),s_00,
                                        (int)((ulong)pcVar7 >> 0x20),(int)pcVar7);
                                N_VScale(0x3ff0000000000000,uVar4,uVar5);
                                SolveIt((void *)0x100000000,
                                        (N_Vector)CONCAT44(uVar2,in_stack_ffffffffffffffa0),s_00,
                                        (int)((ulong)pcVar7 >> 0x20),(int)pcVar7);
                                N_VDestroy(uVar3);
                                N_VDestroy(uVar4);
                                N_VDestroy(uVar5);
                                N_VDestroy(uVar6);
                                N_VDestroy(u_00);
                                KINFree(&stack0xffffffffffffff98);
                                SUNLinSolFree(scsteptol_00);
                                SUNMatDestroy(pcVar7);
                                free(__ptr);
                                SUNContext_Free(&local_10);
                                local_4 = 0;
                              }
                              else {
                                local_4 = 1;
                              }
                            }
                            else {
                              local_4 = 1;
                            }
                          }
                          else {
                            local_4 = 1;
                          }
                        }
                        else {
                          local_4 = 1;
                        }
                      }
                      else {
                        local_4 = 1;
                      }
                    }
                    else {
                      local_4 = 1;
                    }
                  }
                  else {
                    local_4 = 1;
                  }
                }
                else {
                  local_4 = 1;
                }
              }
              else {
                local_4 = 1;
              }
            }
            else {
              local_4 = 1;
            }
          }
          else {
            local_4 = 1;
          }
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(void)
{
  SUNContext sunctx;
  UserData data;
  sunrealtype fnormtol, scsteptol;
  N_Vector u1, u2, u, s, c;
  int glstr, mset, retval;
  void* kmem;
  SUNMatrix J;
  SUNLinearSolver LS;

  u1 = u2 = u = NULL;
  s = c = NULL;
  kmem  = NULL;
  J     = NULL;
  LS    = NULL;
  data  = NULL;

  /* Create the SUNDIALS context that all SUNDIALS objects require */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* User data */

  data        = (UserData)malloc(sizeof *data);
  data->lb[0] = PT25;
  data->ub[0] = ONE;
  data->lb[1] = ONEPT5;
  data->ub[1] = TWO * PI;

  /* Create serial vectors of length NEQ */
  u1 = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)u1, "N_VNew_Serial", 0)) { return (1); }

  u2 = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)u2, "N_VNew_Serial", 0)) { return (1); }

  u = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)u, "N_VNew_Serial", 0)) { return (1); }

  s = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)s, "N_VNew_Serial", 0)) { return (1); }

  c = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)c, "N_VNew_Serial", 0)) { return (1); }

  SetInitialGuess1(u1, data);
  SetInitialGuess2(u2, data);

  N_VConst(ONE, s); /* no scaling */

  Ith(c, 1) = ZERO; /* no constraint on x1 */
  Ith(c, 2) = ZERO; /* no constraint on x2 */
  Ith(c, 3) = ONE;  /* l1 = x1 - x1_min >= 0 */
  Ith(c, 4) = -ONE; /* L1 = x1 - x1_max <= 0 */
  Ith(c, 5) = ONE;  /* l2 = x2 - x2_min >= 0 */
  Ith(c, 6) = -ONE; /* L2 = x2 - x22_min <= 0 */

  fnormtol  = FTOL;
  scsteptol = STOL;

  kmem = KINCreate(sunctx);
  if (check_retval((void*)kmem, "KINCreate", 0)) { return (1); }

  retval = KINSetUserData(kmem, data);
  if (check_retval(&retval, "KINSetUserData", 1)) { return (1); }
  retval = KINSetConstraints(kmem, c);
  if (check_retval(&retval, "KINSetConstraints", 1)) { return (1); }
  retval = KINSetFuncNormTol(kmem, fnormtol);
  if (check_retval(&retval, "KINSetFuncNormTol", 1)) { return (1); }
  retval = KINSetScaledStepTol(kmem, scsteptol);
  if (check_retval(&retval, "KINSetScaledStepTol", 1)) { return (1); }

  retval = KINInit(kmem, func, u);
  if (check_retval(&retval, "KINInit", 1)) { return (1); }

  /* Create dense SUNMatrix */
  J = SUNDenseMatrix(NEQ, NEQ, sunctx);
  if (check_retval((void*)J, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LS = SUNLinSol_Dense(u, J, sunctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver to KINSOL */
  retval = KINSetLinearSolver(kmem, LS, J);
  if (check_retval(&retval, "KINSetLinearSolver", 1)) { return (1); }

  /* Print out the problem size, solution parameters, initial guess. */
  PrintHeader(fnormtol, scsteptol);

  /* --------------------------- */

  printf("\n------------------------------------------\n");
  printf("\nInitial guess on lower bounds\n");
  printf("  [x1,x2] = ");
  PrintOutput(u1);

  N_VScale(ONE, u1, u);
  glstr = KIN_NONE;
  mset  = 1;
  SolveIt(kmem, u, s, glstr, mset);

  /* --------------------------- */

  N_VScale(ONE, u1, u);
  glstr = KIN_LINESEARCH;
  mset  = 1;
  SolveIt(kmem, u, s, glstr, mset);

  /* --------------------------- */

  N_VScale(ONE, u1, u);
  glstr = KIN_NONE;
  mset  = 0;
  SolveIt(kmem, u, s, glstr, mset);

  /* --------------------------- */

  N_VScale(ONE, u1, u);
  glstr = KIN_LINESEARCH;
  mset  = 0;
  SolveIt(kmem, u, s, glstr, mset);

  /* --------------------------- */

  printf("\n------------------------------------------\n");
  printf("\nInitial guess in middle of feasible region\n");
  printf("  [x1,x2] = ");
  PrintOutput(u2);

  N_VScale(ONE, u2, u);
  glstr = KIN_NONE;
  mset  = 1;
  SolveIt(kmem, u, s, glstr, mset);

  /* --------------------------- */

  N_VScale(ONE, u2, u);
  glstr = KIN_LINESEARCH;
  mset  = 1;
  SolveIt(kmem, u, s, glstr, mset);

  /* --------------------------- */

  N_VScale(ONE, u2, u);
  glstr = KIN_NONE;
  mset  = 0;
  SolveIt(kmem, u, s, glstr, mset);

  /* --------------------------- */

  N_VScale(ONE, u2, u);
  glstr = KIN_LINESEARCH;
  mset  = 0;
  SolveIt(kmem, u, s, glstr, mset);

  /* Free memory */

  N_VDestroy(u1);
  N_VDestroy(u2);
  N_VDestroy(u);
  N_VDestroy(s);
  N_VDestroy(c);
  KINFree(&kmem);
  SUNLinSolFree(LS);
  SUNMatDestroy(J);
  free(data);
  SUNContext_Free(&sunctx);

  return (0);
}